

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Value * __thiscall
GlobOpt::GetIntConstantValue(GlobOpt *this,int64 intConst,Instr *instr,Opnd *opnd)

{
  Sym *sym;
  code *pcVar1;
  bool bVar2;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar3;
  Value **ppVVar4;
  Value *val;
  Value *pVVar5;
  Value *local_40;
  int64 symStoreIntConstantValue;
  int64 intConst_local;
  
  symStoreIntConstantValue = intConst;
  this_00 = Func::GetJITFunctionBody(instr->m_func);
  bVar2 = JITTimeFunctionBody::IsWasmFunction(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x10a6,"(instr->m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "instr->m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_40 = (Value *)0x0;
  ppVVar4 = JsUtil::
            BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::LookupWithKey<long>(this->int64ConstantToValueMap,&symStoreIntConstantValue,&local_40)
  ;
  pVVar5 = *ppVVar4;
  if ((pVVar5 != (Value *)0x0) && (sym = pVVar5->valueInfo->symStore, sym != (Sym *)0x0)) {
    bVar2 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,sym);
    if (bVar2) {
      val = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,sym);
      if ((val != (Value *)0x0) && (val->valueNumber == pVVar5->valueNumber)) {
        bVar2 = ValueInfo::TryGetInt64ConstantValue(val->valueInfo,(int64 *)&local_40,false);
        if ((bVar2) && (local_40 == (Value *)symStoreIntConstantValue)) goto LAB_0042aff2;
      }
    }
  }
  val = NewInt64ConstantValue(this,symStoreIntConstantValue,instr);
LAB_0042aff2:
  pVVar5 = GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,val,opnd);
  return pVVar5;
}

Assistant:

Value *
GlobOpt::GetIntConstantValue(const int64 intConst, IR::Instr * instr, IR::Opnd *const opnd)
{
    Assert(instr->m_func->GetJITFunctionBody()->IsWasmFunction());

    Value *value = nullptr;
    Value *const cachedValue = this->int64ConstantToValueMap->Lookup(intConst, nullptr);

    if (cachedValue)
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *const symStore = cachedValue->GetValueInfo()->GetSymStore();
        if (symStore && this->currentBlock->globOptData.IsLive(symStore))
        {

            Value *const symStoreValue = this->currentBlock->globOptData.FindValue(symStore);
            int64 symStoreIntConstantValue;
            if (symStoreValue &&
                symStoreValue->GetValueNumber() == cachedValue->GetValueNumber() &&
                symStoreValue->GetValueInfo()->TryGetInt64ConstantValue(&symStoreIntConstantValue, false) &&
                symStoreIntConstantValue == intConst)
            {
                value = symStoreValue;
            }
        }
    }

    if (!value)
    {
        value = NewInt64ConstantValue(intConst, instr);
    }

    return this->currentBlock->globOptData.InsertNewValue(value, opnd);
}